

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileParser::~cmListFileParser(cmListFileParser *this)

{
  cmListFileLexer_Delete(this->Lexer);
  cmListFileFunction::~cmListFileFunction(&this->Function);
  return;
}

Assistant:

cmListFileParser::~cmListFileParser()
{
  cmListFileLexer_Delete(this->Lexer);
}